

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O0

void WebRtcIsac_InitPitchAnalysis(PitchAnalysisStruct *State)

{
  int local_14;
  int k;
  PitchAnalysisStruct *State_local;
  
  for (local_14 = 0; local_14 < 0x48; local_14 = local_14 + 1) {
    State->dec_buffer[local_14] = 0.0;
  }
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    State->decimator_state[local_14] = 0.0;
  }
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    State->hp_state[local_14] = 0.0;
  }
  for (local_14 = 0; local_14 < 0x18; local_14 = local_14 + 1) {
    State->whitened_buf[local_14] = 0.0;
  }
  for (local_14 = 0; local_14 < 0x18; local_14 = local_14 + 1) {
    State->inbuf[local_14] = 0.0;
  }
  WebRtcIsac_InitPitchFilter(&State->PFstr_wght);
  WebRtcIsac_InitPitchFilter(&State->PFstr);
  WebRtcIsac_InitWeightingFilter(&State->Wghtstr);
  return;
}

Assistant:

void WebRtcIsac_InitPitchAnalysis(PitchAnalysisStruct *State)
{
  int k;

  for (k = 0; k < PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2; k++)
    State->dec_buffer[k] = 0.0;
  for (k = 0; k < 2*ALLPASSSECTIONS+1; k++)
    State->decimator_state[k] = 0.0;
  for (k = 0; k < 2; k++)
    State->hp_state[k] = 0.0;
  for (k = 0; k < QLOOKAHEAD; k++)
    State->whitened_buf[k] = 0.0;
  for (k = 0; k < QLOOKAHEAD; k++)
    State->inbuf[k] = 0.0;

  WebRtcIsac_InitPitchFilter(&(State->PFstr_wght));

  WebRtcIsac_InitPitchFilter(&(State->PFstr));

  WebRtcIsac_InitWeightingFilter(&(State->Wghtstr));
}